

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_err_t flat_file_destroy(ion_flat_file_t *flat_file)

{
  int iVar1;
  char local_25 [8];
  char filename [12];
  ion_err_t err;
  ion_flat_file_t *flat_file_local;
  
  unique0x1000008b = flat_file;
  filename[4] = flat_file_close(flat_file);
  flat_file_local._7_1_ = filename[4];
  if (filename[4] == '\0') {
    dictionary_get_filename((stack0xffffffffffffffe8->super).id,"ffs",local_25);
    iVar1 = remove(local_25);
    if (iVar1 == 0) {
      stack0xffffffffffffffe8->data_file = (FILE *)0x0;
      flat_file_local._7_1_ = '\0';
    }
    else {
      flat_file_local._7_1_ = '\v';
    }
  }
  return flat_file_local._7_1_;
}

Assistant:

ion_err_t
flat_file_destroy(
	ion_flat_file_t *flat_file
) {
	ion_err_t err = flat_file_close(flat_file);

	if (err_ok != err) {
		return err;
	}

	char filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(flat_file->super.id, "ffs", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	flat_file->data_file = NULL;

	return err_ok;
}